

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phashtable.c
# Opt level: O0

void p_hash_table_remove(PHashTable *table,pconstpointer key)

{
  puint hash_00;
  PHashTableNode *pPVar1;
  PHashTableNode *pPStack_28;
  puint hash;
  PHashTableNode *prev_node;
  PHashTableNode *node;
  pconstpointer key_local;
  PHashTable *table_local;
  
  if (table != (PHashTable *)0x0) {
    hash_00 = pp_hash_table_calc_hash(key,table->size);
    pPVar1 = pp_hash_table_find_node(table,key,hash_00);
    if (pPVar1 != (PHashTableNode *)0x0) {
      prev_node = table->table[hash_00];
      pPStack_28 = (PHashTableNode *)0x0;
      for (; prev_node != (PHashTableNode *)0x0; prev_node = prev_node->next) {
        if (prev_node->key == key) {
          if (pPStack_28 == (PHashTableNode *)0x0) {
            table->table[hash_00] = prev_node->next;
          }
          else {
            pPStack_28->next = prev_node->next;
          }
          p_free(prev_node);
          return;
        }
        pPStack_28 = prev_node;
      }
    }
  }
  return;
}

Assistant:

P_LIB_API void
p_hash_table_remove (PHashTable *table, pconstpointer key)
{
	PHashTableNode	*node;
	PHashTableNode	*prev_node;
	puint		hash;

	if (P_UNLIKELY (table == NULL))
		return;

	hash = pp_hash_table_calc_hash (key, table->size);

	if (pp_hash_table_find_node (table, key, hash) != NULL) {
		node = table->table[hash];
		prev_node = NULL;

		while (node != NULL) {
			if (node->key == key) {
				if (prev_node == NULL)
					table->table[hash] = node->next;
				else
					prev_node->next = node->next;

				p_free (node);
				break;
			} else {
				prev_node = node;
				node = node->next;
			}
		}
	}
}